

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall despot::BaseTag::BaseTag(BaseTag *this)

{
  allocator<char> local_326;
  allocator<char> local_325;
  allocator<char> local_324;
  allocator<char> local_323;
  allocator<char> local_322;
  allocator<char> local_321 [17];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  istringstream iss;
  
  *(code **)this = std::__cxx11::ostringstream::~ostringstream;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  despot::BeliefMDP::BeliefMDP(&this->super_BeliefMDP);
  *(undefined ***)this = &PTR__BaseTag_00121440;
  *(undefined ***)&this->super_BeliefMDP = &PTR__BaseTag_00121570;
  *(undefined ***)&this->super_StateIndexer = &PTR__BaseTag_00121678;
  *(undefined ***)&this->super_StatePolicy = &PTR__BaseTag_001216b0;
  *(undefined ***)&this->super_MMAPInferencer = &PTR__BaseTag_001216d8;
  despot::Floor::Floor(&this->floor_);
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_pool_).num_allocated_ = 0;
  (this->states_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->states_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->states_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  current_ = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"mapSize = 5 10\n",local_321);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"#####...##\n",&local_322)
  ;
  std::operator+(&local_250,&local_270,&local_290);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"#####...##\n",&local_323)
  ;
  std::operator+(&local_230,&local_250,&local_2b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"#####...##\n",&local_324)
  ;
  std::operator+(&local_210,&local_230,&local_2d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"...........\n",&local_325);
  std::operator+(&local_1f0,&local_210,&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"...........",&local_326);
  std::operator+(&local_1d0,&local_1f0,&local_310);
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&local_1d0,_S_in);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  Init(this,(istream *)&iss);
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  return;
}

Assistant:

BaseTag::BaseTag() :
  robot_pos_unknown_(false) {
	current_ = this;
	istringstream iss(
		string("mapSize = 5 10\n") + string("#####...##\n")
			+ string("#####...##\n") + string("#####...##\n")
			+ string("...........\n") + string("..........."));
	Init(iss);
}